

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>::Match
          (ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_> *this,
          Matcher *matcher,char16 *input,CharCount inputLength,CharCount *inputOffset)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Program *pPVar4;
  uint uVar5;
  uint patLen;
  
  uVar5 = (this->super_LiteralMixin).offset;
  patLen = (this->super_LiteralMixin).length;
  pPVar4 = (matcher->program).ptr;
  if ((pPVar4->rep).insts.litbufLen - uVar5 < patLen) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x28d,"(length <= matcher.program->rep.insts.litbufLen - offset)",
                       "length <= matcher.program->rep.insts.litbufLen - offset");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pPVar4 = (matcher->program).ptr;
    uVar5 = (this->super_LiteralMixin).offset;
    patLen = (this->super_LiteralMixin).length;
  }
  bVar2 = TextbookBoyerMooreWithLinearMap<char16_t>::Match<1u>
                    (&this->scanner,input,inputLength,inputOffset,
                     (pPVar4->rep).insts.litbuf.ptr + uVar5,patLen,matcher->stats);
  return bVar2;
}

Assistant:

inline bool
    ScannerMixinT<ScannerT>::Match(Matcher& matcher, const char16 * const input, const CharCount inputLength, CharCount& inputOffset) const
    {
        Assert(length <= matcher.program->rep.insts.litbufLen - offset);
        return scanner.template Match<1>(
            input
            , inputLength
            , inputOffset
            , matcher.program->rep.insts.litbuf + offset
            , length
#if ENABLE_REGEX_CONFIG_OPTIONS
            , matcher.stats
#endif
            );
    }